

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O0

ALLEGRO_FS_ENTRY * fs_stdio_read_directory(ALLEGRO_FS_ENTRY *fp)

{
  int iVar1;
  int iVar2;
  dirent *pdVar3;
  size_t sVar4;
  WRAP_CHAR *abs_path;
  long in_RDI;
  char *buf;
  int ent_name_len;
  int abs_path_len;
  ALLEGRO_FS_ENTRY *ret;
  WRAP_DIRENT_TYPE *ent;
  ALLEGRO_FS_ENTRY_STDIO *fp_stdio;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  size_t in_stack_ffffffffffffffc8;
  ALLEGRO_FS_ENTRY *local_8;
  
  do {
    pdVar3 = readdir(*(DIR **)(in_RDI + 0xa8));
    if (pdVar3 == (dirent *)0x0) {
      __errno_location();
      al_set_errno(in_stack_ffffffffffffffc4);
      return (ALLEGRO_FS_ENTRY *)0x0;
    }
    iVar1 = strcmp(pdVar3->d_name,".");
    in_stack_ffffffffffffffc4 = CONCAT13(1,(int3)in_stack_ffffffffffffffc4);
    if (iVar1 != 0) {
      iVar1 = strcmp(pdVar3->d_name,"..");
      in_stack_ffffffffffffffc4 = CONCAT13(iVar1 == 0,(int3)in_stack_ffffffffffffffc4);
    }
  } while ((char)((uint)in_stack_ffffffffffffffc4 >> 0x18) != '\0');
  sVar4 = strlen(*(char **)(in_RDI + 8));
  iVar1 = (int)sVar4;
  sVar4 = strlen(pdVar3->d_name);
  iVar2 = (int)sVar4;
  abs_path = (WRAP_CHAR *)
             al_malloc_with_context
                       (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                        in_stack_ffffffffffffffb8,(char *)0x177aeb);
  if (abs_path == (WRAP_CHAR *)0x0) {
    al_set_errno(in_stack_ffffffffffffffc4);
    local_8 = (ALLEGRO_FS_ENTRY *)0x0;
  }
  else {
    memcpy(abs_path,*(void **)(in_RDI + 8),(long)iVar1);
    if ((iVar1 < 1) || (abs_path[iVar1 + -1] != '/')) {
      abs_path[iVar1] = '/';
      memcpy(abs_path + (long)iVar1 + 1,pdVar3->d_name,(long)iVar2);
      abs_path[iVar1 + 1 + iVar2] = '\0';
    }
    else {
      memcpy(abs_path + iVar1,pdVar3->d_name,(long)iVar2);
      abs_path[iVar1 + iVar2] = '\0';
    }
    local_8 = create_abs_path_entry(abs_path);
    al_free_with_context
              ((void *)CONCAT44(iVar1,iVar2),(int)((ulong)abs_path >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
  }
  return local_8;
}

Assistant:

static ALLEGRO_FS_ENTRY *fs_stdio_read_directory(ALLEGRO_FS_ENTRY *fp)
{
   ALLEGRO_FS_ENTRY_STDIO *fp_stdio = (ALLEGRO_FS_ENTRY_STDIO *) fp;
   // FIXME: Must use readdir_r as Allegro allows file functions being
   // called from different threads.
   WRAP_DIRENT_TYPE *ent;
   ALLEGRO_FS_ENTRY *ret;

   ASSERT(fp_stdio->dir);

   do {
      ent = WRAP_READDIR(fp_stdio->dir);
      if (!ent) {
         al_set_errno(errno);
         return NULL;
      }
      /* Don't bother the user with these entries. */
   } while (0 == WRAP_STRCMP(ent->d_name, WRAP_LIT("."))
         || 0 == WRAP_STRCMP(ent->d_name, WRAP_LIT("..")));

#ifdef ALLEGRO_WINDOWS
   {
      wchar_t buf[MAX_PATH];
      int buflen;
      
      buflen = _snwprintf(buf, MAX_PATH, L"%s\\%s",
         fp_stdio->abs_path, ent->d_name);
      if (buflen >= MAX_PATH) {
         al_set_errno(ERANGE);
         return NULL;
      }
      ret = create_abs_path_entry(buf);
   }
#else
   {
      int abs_path_len = strlen(fp_stdio->abs_path);
      int ent_name_len = strlen(ent->d_name);
      char *buf = al_malloc(abs_path_len + 1 + ent_name_len + 1);
      if (!buf) {
         al_set_errno(ENOMEM);
         return NULL;
      }
      memcpy(buf, fp_stdio->abs_path, abs_path_len);
      if (  (abs_path_len >= 1) &&
            buf[abs_path_len - 1] == ALLEGRO_NATIVE_PATH_SEP)
      {
         /* do NOT add a new separator if we have one already */
         memcpy(buf + abs_path_len, ent->d_name, ent_name_len);
         buf[abs_path_len + ent_name_len] = '\0';
      }
      else {
         /* append separator */
         buf[abs_path_len] = ALLEGRO_NATIVE_PATH_SEP;
         memcpy(buf + abs_path_len + 1, ent->d_name, ent_name_len);
         buf[abs_path_len + 1 + ent_name_len] = '\0';
      }
      ret = create_abs_path_entry(buf);
      al_free(buf);
   }
#endif
   return ret;
}